

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O1

void arti_speak(obj *obj)

{
  int truth;
  artifact *paVar1;
  char *pcVar2;
  char *pcVar3;
  char buf [256];
  char acStack_118 [264];
  
  if ((obj == (obj *)0x0) || ((long)obj->oartifact == 0)) {
    paVar1 = (artifact *)0x0;
  }
  else {
    paVar1 = artilist + obj->oartifact;
  }
  if ((paVar1 != (artifact *)0x0) && ((paVar1->spfx & 8) != 0)) {
    truth = bcsign(obj);
    pcVar2 = getrumor(truth,acStack_118,'\x01');
    pcVar3 = "Rumors file closed for renovation.";
    if (*pcVar2 != '\0') {
      pcVar3 = pcVar2;
    }
    pcVar2 = Tobjnam(obj,"whisper");
    pline("%s:",pcVar2);
    verbalize("%s",pcVar3);
  }
  return;
}

Assistant:

void arti_speak(struct obj *obj)
{
	const struct artifact *oart = get_artifact(obj);
	const char *line;
	char buf[BUFSZ];


	/* Is this a speaking artifact? */
	if (!oart || !(oart->spfx & SPFX_SPEAK))
		return;

	line = getrumor(bcsign(obj), buf, TRUE);
	if (!*line)
		line = "Rumors file closed for renovation.";
	pline("%s:", Tobjnam(obj, "whisper"));
	verbalize("%s", line);
	return;
}